

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O2

void __thiscall
TEST_WiningStateTest_DeadWallDraw_TestShell::~TEST_WiningStateTest_DeadWallDraw_TestShell
          (TEST_WiningStateTest_DeadWallDraw_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(WiningStateTest, DeadWallDraw)
{
	addNoWiningHand(true);

	SelfDrawnSituation situation;
	situation.is_dead_wall = true;

	selfDrawn(situation);
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::DeadWallDraw));
	CHECK_EQUAL(1, r.doubling_factor);
}